

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemHandleBom(Mem *pMem)

{
  char cVar1;
  long in_RDI;
  u8 b2;
  u8 b1;
  u8 bom;
  int rc;
  Mem *in_stack_ffffffffffffffe8;
  char local_d;
  int local_c;
  
  local_c = 0;
  local_d = '\0';
  if (1 < *(int *)(in_RDI + 0x10)) {
    cVar1 = *(char *)(*(long *)(in_RDI + 8) + 1);
    if ((**(char **)(in_RDI + 8) == -2) && (cVar1 == -1)) {
      local_d = '\x03';
    }
    if ((**(char **)(in_RDI + 8) == -1) && (cVar1 == -2)) {
      local_d = '\x02';
    }
  }
  if ((local_d != '\0') &&
     (local_c = sqlite3VdbeMemMakeWriteable(in_stack_ffffffffffffffe8), local_c == 0)) {
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -2;
    memmove(*(void **)(in_RDI + 8),(void *)(*(long *)(in_RDI + 8) + 2),(long)*(int *)(in_RDI + 0x10)
           );
    *(undefined1 *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x10)) = 0;
    *(undefined1 *)(*(long *)(in_RDI + 8) + (long)(*(int *)(in_RDI + 0x10) + 1)) = 0;
    *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) | 0x200;
    *(char *)(in_RDI + 0x16) = local_d;
  }
  return local_c;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemHandleBom(Mem *pMem){
  int rc = SQLITE_OK;
  u8 bom = 0;

  assert( pMem->n>=0 );
  if( pMem->n>1 ){
    u8 b1 = *(u8 *)pMem->z;
    u8 b2 = *(((u8 *)pMem->z) + 1);
    if( b1==0xFE && b2==0xFF ){
      bom = SQLITE_UTF16BE;
    }
    if( b1==0xFF && b2==0xFE ){
      bom = SQLITE_UTF16LE;
    }
  }

  if( bom ){
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc==SQLITE_OK ){
      pMem->n -= 2;
      memmove(pMem->z, &pMem->z[2], pMem->n);
      pMem->z[pMem->n] = '\0';
      pMem->z[pMem->n+1] = '\0';
      pMem->flags |= MEM_Term;
      pMem->enc = bom;
    }
  }
  return rc;
}